

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall google::anon_unknown_1::FlagRegistry::Unlock(FlagRegistry *this)

{
  FlagRegistry *this_local;
  
  gflags_mutex_namespace::Mutex::Unlock(&this->lock_);
  return;
}

Assistant:

void Unlock() { lock_.Unlock(); }